

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

string * __thiscall
pbrt::MLTSampler::DumpState_abi_cxx11_(string *__return_storage_ptr__,MLTSampler *this)

{
  float *in_RCX;
  long lVar1;
  PrimarySample *fmt;
  string sStack_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  fmt = (this->X).ptr;
  for (lVar1 = (this->X).nStored << 5; lVar1 != 0; lVar1 = lVar1 + -0x20) {
    StringPrintf<float_const&>(&sStack_48,(pbrt *)"%f,",(char *)fmt,in_RCX);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_48);
    fmt = fmt + 1;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string MLTSampler::DumpState() const {
    std::string state;
    for (const PrimarySample &Xi : X)
        state += StringPrintf("%f,", Xi.value);
    state += "0";
    return state;
}